

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O3

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  code *pcVar1;
  long lVar2;
  FILE *__stream;
  Iterator IVar3;
  usize uVar4;
  int iVar5;
  uint32 uVar6;
  int *piVar7;
  char *pcVar8;
  undefined1 this_00 [8];
  char *pcVar9;
  char **in_RCX;
  uint in_R8D;
  Map<String,_String> *in_R9;
  Iterator end;
  char **ppcVar10;
  char **ppcVar11;
  char *pcStack_80;
  char *pcStack_78;
  char **local_70;
  undefined1 auStack_68 [8];
  Array<String> envStringsBuf;
  undefined8 local_48;
  int stdoutFds [2];
  int stderrFds [2];
  int stdinFds [2];
  
  ppcVar10 = &pcStack_78;
  if (this->pid != 0) {
    pcStack_80 = (char *)0x104b50;
    piVar7 = __errno_location();
    *piVar7 = 0x16;
    return 0;
  }
  local_48 = 0;
  stdoutFds[0] = 0;
  stdoutFds[1] = 0;
  stderrFds[0] = 0;
  stderrFds[1] = 0;
  envStringsBuf._capacity = (usize)__file;
  if ((in_R8D & 1) != 0) {
    pcStack_80 = (char *)0x104b8a;
    iVar5 = pipe((int *)&local_48);
    if (iVar5 != 0) goto LAB_00104bb2;
  }
  if ((in_R8D & 2) != 0) {
    pcStack_80 = (char *)0x104b9c;
    iVar5 = pipe(stdoutFds);
    if (iVar5 != 0) goto LAB_00104bb2;
  }
  if ((in_R8D & 4) != 0) {
    pcStack_80 = (char *)0x104bae;
    iVar5 = pipe(stderrFds);
    if (iVar5 != 0) {
LAB_00104bb2:
      pcStack_80 = (char *)0x104bb7;
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      if ((int)local_48 != 0) {
        pcStack_80 = (char *)0x104bc9;
        ::close((int)local_48);
        pcStack_80 = (char *)0x104bd1;
        ::close(local_48._4_4_);
      }
      if (stdoutFds[0] != 0) {
        pcStack_80 = (char *)0x104bdd;
        ::close(stdoutFds[0]);
        pcStack_80 = (char *)0x104be5;
        ::close(stdoutFds[1]);
      }
      if (stderrFds[0] != 0) {
        pcStack_80 = (char *)0x104bf1;
        ::close(stderrFds[0]);
        pcStack_80 = (char *)0x104bf9;
        ::close(stderrFds[1]);
      }
      *piVar7 = iVar5;
      return 0;
    }
  }
  if ((__oflag == 0) || (in_RCX[(long)__oflag + -1] != (char *)0x0)) {
    iVar5 = __oflag + (uint)(__oflag == 0);
    lVar2 = -((long)iVar5 * 8 + 0x17U & 0xfffffffffffffff0);
    ppcVar10 = (char **)((long)&pcStack_78 + lVar2);
    ppcVar10[iVar5] = (char *)0x0;
    if (1 < iVar5) {
      *(undefined8 *)((long)&pcStack_80 + lVar2) = 0x104c64;
      memcpy((void *)((long)&local_70 + lVar2),in_RCX + 1,(ulong)(iVar5 - 1) << 3);
    }
    uVar4 = envStringsBuf._capacity;
    *(undefined8 *)((long)&pcStack_80 + lVar2) = 0x104c6d;
    pcVar8 = String::operator_cast_to_char_((String *)uVar4);
    *ppcVar10 = pcVar8;
    in_RCX = ppcVar10;
  }
  auStack_68 = (undefined1  [8])0x0;
  envStringsBuf._begin.item = (String *)0x0;
  envStringsBuf._end.item = (String *)0x0;
  ppcVar11 = _environ;
  if (in_R9->root != (Item *)0x0) {
    local_70 = in_RCX;
    ppcVar10[-1] = (char *)0x104ca6;
    anon_unknown.dwarf_6e63::prepareEnv(in_R9,(Array<String> *)auStack_68);
    IVar3 = envStringsBuf._begin;
    ppcVar10 = (char **)((long)ppcVar10 -
                        (((ulong)((long)envStringsBuf._begin.item - (long)auStack_68) >> 3) *
                         0x6666666666666668 + 0x17 & 0xfffffffffffffff0));
    ppcVar11 = ppcVar10;
    for (this_00 = auStack_68; (undefined1  [8])IVar3.item != this_00;
        this_00 = (undefined1  [8])((long)this_00 + 0x28)) {
      ppcVar10[-1] = (char *)0x104cea;
      pcVar8 = String::operator_cast_to_char_((String *)this_00);
      *ppcVar11 = pcVar8;
      ppcVar11 = ppcVar11 + 1;
    }
    *ppcVar11 = (char *)0x0;
    in_RCX = local_70;
    ppcVar11 = ppcVar10;
  }
  ppcVar10[-1] = (char *)0x104d19;
  uVar6 = vfork();
  if (uVar6 != 0xffffffff) {
    iVar5 = local_48._4_4_;
    if (uVar6 != 0) {
      this->pid = uVar6;
      if (local_48._4_4_ != 0) {
        ppcVar10[-1] = (char *)0x104def;
        ::close(iVar5);
      }
      iVar5 = stdoutFds[1];
      if (stdoutFds[1] != 0) {
        ppcVar10[-1] = (char *)0x104dfb;
        ::close(iVar5);
      }
      iVar5 = stderrFds[0];
      if (stderrFds[0] != 0) {
        ppcVar10[-1] = (char *)0x104e07;
        ::close(iVar5);
      }
      this->fdStdOutRead = (int)local_48;
      this->fdStdErrRead = stdoutFds[0];
      this->fdStdInWrite = stderrFds[1];
      iVar5 = (int)CONCAT71((uint7)stderrFds[1]._1_3_,1);
      goto LAB_00104e1d;
    }
    if (local_48._4_4_ != 0) {
      ppcVar10[-1] = (char *)0x104d3b;
      dup2(iVar5,1);
      iVar5 = local_48._4_4_;
      ppcVar10[-1] = (char *)0x104d43;
      ::close(iVar5);
    }
    iVar5 = stdoutFds[1];
    if (stdoutFds[1] != 0) {
      ppcVar10[-1] = (char *)0x104d54;
      dup2(iVar5,2);
      iVar5 = stdoutFds[1];
      ppcVar10[-1] = (char *)0x104d5c;
      ::close(iVar5);
    }
    iVar5 = stderrFds[0];
    if (stderrFds[0] != 0) {
      ppcVar10[-1] = (char *)0x104d6a;
      dup2(iVar5,0);
      iVar5 = stderrFds[0];
      ppcVar10[-1] = (char *)0x104d72;
      ::close(iVar5);
    }
    iVar5 = (int)local_48;
    if ((int)local_48 != 0) {
      ppcVar10[-1] = (char *)0x104d7e;
      ::close(iVar5);
    }
    iVar5 = stdoutFds[0];
    if (stdoutFds[0] != 0) {
      ppcVar10[-1] = (char *)0x104d8a;
      ::close(iVar5);
    }
    iVar5 = stderrFds[1];
    if (stderrFds[1] != 0) {
      ppcVar10[-1] = (char *)0x104d96;
      ::close(iVar5);
    }
    uVar4 = envStringsBuf._capacity;
    ppcVar10[-1] = (char *)0x104d9f;
    pcVar8 = String::operator_cast_to_char_((String *)uVar4);
    ppcVar10[-1] = (char *)0x104dad;
    iVar5 = execvpe(pcVar8,in_RCX,ppcVar11);
    uVar4 = envStringsBuf._capacity;
    __stream = _stderr;
    if (iVar5 == -1) {
      ppcVar10[-1] = (char *)0x104e42;
      pcVar8 = String::operator_cast_to_char_((String *)uVar4);
      ppcVar10[-1] = (char *)0x104e4a;
      piVar7 = __errno_location();
      iVar5 = *piVar7;
      ppcVar10[-1] = (char *)0x104e51;
      pcVar9 = strerror(iVar5);
      ppcVar10[-1] = (char *)0x104e68;
      fprintf(__stream,"%s: %s\n",pcVar8,pcVar9);
      ppcVar10[-1] = (char *)0x104e72;
      _exit(1);
    }
    ppcVar10[-1] = (char *)0x104dd3;
    iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                          ,0x2c5,"false");
    if (iVar5 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  iVar5 = 0;
LAB_00104e1d:
  ppcVar10[-1] = (char *)0x104e28;
  Array<String>::~Array((Array<String> *)auStack_68);
  return iVar5;
}

Assistant:

bool Process::open(const String& executable, int argc, char* const argv[], uint streams, const Map<String, String>& environment)
{
#ifdef _WIN32
  return open(Private::getCommandLine(executable, argc, argv), streams);
#else
  if (pid)
  {
    errno = EINVAL;
    return false;
  }

  // create pipes
  int stdoutFds[2] = {};
  int stderrFds[2] = {};
  int stdinFds[2] = {};
  if (streams & stdoutStream)
  {
    if (pipe(stdoutFds) != 0)
      goto error;
  }
  if (streams & stderrStream)
  {
    if (pipe(stderrFds) != 0)
      goto error;
  }
  if (streams & stdinStream)
  {
    if (pipe(stdinFds) != 0)
      goto error;
  }

  {

    // prepare argv of child
    const char** args;
    if (argc && !argv[argc - 1])
      args = (const char**)argv;
    else
    {
      if (!argc)
        ++argc;
      args = (const char**)alloca(sizeof(const char*) * (argc + 1));
      args[argc] = 0;
      for (int i = 1; i < argc; ++i)
        args[i] = argv[i];
      args[0] = executable;
    }

    // prepare env of child
    char** env = ::environ;
    Array<String> envStringsBuf;
    if (!environment.isEmpty())
    {
      prepareEnv(environment, envStringsBuf);
      env = (char**)alloca(sizeof(char*) * (envStringsBuf.size() + 1));
      char** ienv = env;
      for (Array<String>::Iterator i = envStringsBuf.begin(), end = envStringsBuf.end(); i != end; ++i)
        *(ienv++) = (char*)(const char*)*i;
      *ienv = 0;
    }

    // start process
    {
      int r = vfork();
      if (r == -1)
        return false;
      else if (r != 0) // parent
      {
        pid = r;

        if (stdoutFds[1])
          ::close(stdoutFds[1]);
        if (stderrFds[1])
          ::close(stderrFds[1]);
        if (stdinFds[0])
          ::close(stdinFds[0]);

        fdStdOutRead = stdoutFds[0];
        fdStdErrRead = stderrFds[0];
        fdStdInWrite = stdinFds[1];

        return true;
      }
      else // child
      {
        if (stdoutFds[1])
        {
          dup2(stdoutFds[1], STDOUT_FILENO);
          ::close(stdoutFds[1]);
        }
        if (stderrFds[1])
        {
          dup2(stderrFds[1], STDERR_FILENO);
          ::close(stderrFds[1]);
        }
        if (stdinFds[0])
        {
          dup2(stdinFds[0], STDIN_FILENO);
          ::close(stdinFds[0]);
        }

        if (stdoutFds[0])
          ::close(stdoutFds[0]);
        if (stderrFds[0])
          ::close(stderrFds[0]);
        if (stdinFds[1])
          ::close(stdinFds[1]);

        if (execvpe(executable, (char* const*)args, env) == -1)
        {
          fprintf(stderr, "%s: %s\n", (const char*)executable, strerror(errno));
          _exit(EXIT_FAILURE);
        }
        ASSERT(false); // unreachable
        return false;
      }
    }
  }
error:
  int err = errno;
  if (stdoutFds[0])
  {
    ::close(stdoutFds[0]);
    ::close(stdoutFds[1]);
  }
  if (stderrFds[0])
  {
    ::close(stderrFds[0]);
    ::close(stderrFds[1]);
  }
  if (stdinFds[0])
  {
    ::close(stdinFds[0]);
    ::close(stdinFds[1]);
  }
  errno = err;
  return false;
#endif
}